

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O2

WeakCallback<sznet::net::TcpConnection> * __thiscall
sznet::makeWeakCallback<sznet::net::TcpConnection>
          (WeakCallback<sznet::net::TcpConnection> *__return_storage_ptr__,sznet *this,
          shared_ptr<sznet::net::TcpConnection> *object,offset_in_TcpConnection_to_subr function)

{
  weak_ptr<sznet::net::TcpConnection> local_58;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  std::__weak_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<sznet::net::TcpConnection,void>
            ((__weak_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_48._M_unused._M_object = (shared_ptr<sznet::net::TcpConnection> *)0x0;
  local_48._8_8_ = 0;
  pcStack_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  if (object != (shared_ptr<sznet::net::TcpConnection> *)0x0) {
    pcStack_30 = std::
                 _Function_handler<void_(sznet::net::TcpConnection_*),_void_(sznet::net::TcpConnection::*)()>
                 ::_M_invoke;
    pcStack_38 = std::
                 _Function_handler<void_(sznet::net::TcpConnection_*),_void_(sznet::net::TcpConnection::*)()>
                 ::_M_manager;
    local_48._M_unused._M_object = object;
    local_48._8_8_ = function;
  }
  WeakCallback<sznet::net::TcpConnection>::WeakCallback
            (__return_storage_ptr__,&local_58,
             (function<void_(sznet::net::TcpConnection_*)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_58.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

WeakCallback<CLASS, ARGS...> makeWeakCallback(const std::shared_ptr<CLASS>& object, void (CLASS::*function)(ARGS...))
{
	return WeakCallback<CLASS, ARGS...>(object, function);
}